

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_lyb.c
# Opt level: O0

int lyb_write(lyout *out,uint8_t *buf,size_t count,lyb_state *lybs)

{
  int iVar1;
  uint uVar2;
  lyb_state *plVar3;
  char local_52;
  uint8_t local_51;
  lyb_state *plStack_50;
  uint8_t meta_buf [2];
  size_t to_write;
  size_t r;
  int local_38;
  int full_chunk_i;
  int i;
  int ret;
  lyb_state *lybs_local;
  size_t count_local;
  uint8_t *buf_local;
  lyout *out_local;
  
  full_chunk_i = 0;
  if ((out == (lyout *)0x0) ||
     (lybs_local = (lyb_state *)count, count_local = (size_t)buf, lybs == (lyb_state *)0x0)) {
    __assert_fail("out && lybs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_lyb.c"
                  ,0x147,
                  "int lyb_write(struct lyout *, const uint8_t *, size_t, struct lyb_state *)");
  }
  while( true ) {
    do {
      plStack_50 = lybs_local;
      r._4_4_ = -1;
      for (local_38 = 0; local_38 < lybs->used; local_38 = local_38 + 1) {
        if (0xfe < (long)&plStack_50->written + lybs->written[local_38]) {
          plStack_50 = (lyb_state *)(0xff - lybs->written[local_38]);
          r._4_4_ = local_38;
        }
      }
      if ((r._4_4_ == -1) && (lybs_local == (lyb_state *)0x0)) {
        return full_chunk_i;
      }
      if (plStack_50 != (lyb_state *)0x0) {
        iVar1 = ly_write(out,(char *)count_local,(size_t)plStack_50);
        plVar3 = (lyb_state *)(long)iVar1;
        if (plVar3 < plStack_50) {
          return -1;
        }
        for (local_38 = 0; local_38 < lybs->used; local_38 = local_38 + 1) {
          lybs->written[local_38] = (long)&plVar3->written + lybs->written[local_38];
          if (0xff < lybs->written[local_38]) {
            __assert_fail("lybs->written[i] <= LYB_SIZE_MAX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_lyb.c"
                          ,0x164,
                          "int lyb_write(struct lyout *, const uint8_t *, size_t, struct lyb_state *)"
                         );
          }
        }
        lybs_local = (lyb_state *)((long)lybs_local - (long)plVar3);
        count_local = (long)&plVar3->written + count_local;
        full_chunk_i = full_chunk_i + iVar1;
      }
    } while (r._4_4_ < 0);
    local_52 = (char)lybs->written[r._4_4_];
    local_51 = lybs->inner_chunks[r._4_4_];
    uVar2 = ly_write_skipped(out,lybs->position[r._4_4_],&local_52,2);
    if (uVar2 < 2) {
      return -1;
    }
    lybs->written[r._4_4_] = 0;
    lybs->inner_chunks[r._4_4_] = '\0';
    uVar2 = ly_write_skip(out,2,lybs->position + r._4_4_);
    if (uVar2 < 2) break;
    full_chunk_i = full_chunk_i + uVar2;
    for (local_38 = 0; local_38 < r._4_4_; local_38 = local_38 + 1) {
      if (lybs->inner_chunks[local_38] == 0xff) {
        ly_log(lybs->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_lyb.c"
               ,0x186);
        return -1;
      }
      lybs->inner_chunks[local_38] = lybs->inner_chunks[local_38] + '\x01';
    }
  }
  return -1;
}

Assistant:

static int
lyb_write(struct lyout *out, const uint8_t *buf, size_t count, struct lyb_state *lybs)
{
    int ret = 0, i, full_chunk_i;
    size_t r, to_write;
    uint8_t meta_buf[LYB_META_BYTES];

    assert(out && lybs);

    while (1) {
        /* check for full data chunks */
        to_write = count;
        full_chunk_i = -1;
        for (i = 0; i < lybs->used; ++i) {
            /* we want the innermost chunks resolved first, so replace previous full chunks */
            if (lybs->written[i] + to_write >= LYB_SIZE_MAX) {
                /* full chunk, do not write more than allowed */
                to_write = LYB_SIZE_MAX - lybs->written[i];
                full_chunk_i = i;
            }
        }

        if ((full_chunk_i == -1) && !count) {
            break;
        }

        /* we are actually writing some data, not just finishing another chunk */
        if (to_write) {
            r = ly_write(out, (char *)buf, to_write);
            if (r < to_write) {
                return -1;
            }

            for (i = 0; i < lybs->used; ++i) {
                /* increase all written counters */
                lybs->written[i] += r;
                assert(lybs->written[i] <= LYB_SIZE_MAX);
            }
            /* decrease count/buf */
            count -= r;
            buf += r;

            ret += r;
        }

        if (full_chunk_i > -1) {
            /* write the meta information (inner chunk count and chunk size) */
            meta_buf[0] = lybs->written[full_chunk_i] & 0xFF;
            meta_buf[1] = lybs->inner_chunks[full_chunk_i] & 0xFF;

            r = ly_write_skipped(out, lybs->position[full_chunk_i], (char *)meta_buf, LYB_META_BYTES);
            if (r < LYB_META_BYTES) {
                return -1;
            }

            /* zero written and inner chunks */
            lybs->written[full_chunk_i] = 0;
            lybs->inner_chunks[full_chunk_i] = 0;

            /* skip space for another chunk size */
            r = ly_write_skip(out, LYB_META_BYTES, &lybs->position[full_chunk_i]);
            if (r < LYB_META_BYTES) {
                return -1;
            }

            ret += r;

            /* increase inner chunk count */
            for (i = 0; i < full_chunk_i; ++i) {
                if (lybs->inner_chunks[i] == LYB_INCHUNK_MAX) {
                    LOGINT(lybs->ctx);
                    return -1;
                }
                ++lybs->inner_chunks[i];
            }
        }
    }

    return ret;
}